

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

WriteThirdPartyDescriptorResult * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::writeThirdPartyDescriptor
          (WriteThirdPartyDescriptorResult *__return_storage_ptr__,DeferredThirdPartyClient *this,
          Connection *provider,Connection *recipient,Builder contact)

{
  OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception> *pOVar1;
  Connection *pCVar2;
  bool bVar3;
  uint uVar4;
  Tag TVar5;
  Deferred *this_00;
  RefOrVoid<capnp::AnyPointer::Reader> pRVar6;
  RpcClient *pRVar7;
  RpcConnectionState *pRVar8;
  RefOrVoid<capnp::_::VatNetworkBase::Connection> pCVar9;
  Own<capnp::ClientHook,_std::nullptr_t> local_310;
  Exception local_300;
  Own<capnp::ClientHook,_std::nullptr_t> local_170;
  Exception *local_160;
  Exception *_kj_switch_done_1;
  Exception *error;
  CapTableBuilder *local_148;
  WirePointer *local_140;
  Connected *local_138;
  Connected *_kj_switch_done;
  Connected *connected;
  OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception> *_kj_switch_subject;
  RpcClient *rpcHook;
  Disposer local_110;
  RpcClient *_rpcHook1584;
  ClientHook *hook;
  Own<capnp::AnyPointer::Reader,_std::nullptr_t> local_f0;
  VineInfo local_e0;
  undefined1 local_c8 [32];
  Maybe<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t>_>
  local_a8 [6];
  Deferred *deferred;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 local_28 [8];
  Connection *recipient_local;
  Connection *provider_local;
  DeferredThirdPartyClient *this_local;
  
  local_28 = (undefined1  [8])recipient;
  recipient_local = provider;
  provider_local = (Connection *)this;
  this_local = (DeferredThirdPartyClient *)__return_storage_ptr__;
  bVar3 = kj::
          OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
          ::is<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred>
                    (&this->state);
  pCVar2 = recipient_local;
  if (bVar3) {
    this_00 = kj::
              OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
              ::get<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred>
                        (&this->state);
    pRVar6 = kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>::operator*(&this_00->contact);
    deferred = (Deferred *)(pRVar6->reader).segment;
    local_40 = (pRVar6->reader).capTable;
    local_38 = (pRVar6->reader).pointer;
    local_30 = *(undefined8 *)&(pRVar6->reader).nestingLimit;
    uVar4 = (*pCVar2->_vptr_Connection[9])(pCVar2,local_28);
    if ((uVar4 & 1) != 0) {
      local_a8[5].ptr.ptr =
           (VineInfo *)
           kj::
           OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
           ::get<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred>
                     (&this->state);
      pCVar2 = recipient_local;
      pRVar6 = kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>::operator*
                         ((Own<capnp::AnyPointer::Reader,_std::nullptr_t> *)local_a8[5].ptr.ptr);
      local_a8[3].ptr.disposer = (Disposer *)(pRVar6->reader).segment;
      local_a8[3].ptr.ptr = (VineInfo *)(pRVar6->reader).capTable;
      local_a8[4].ptr.disposer = (Disposer *)(pRVar6->reader).pointer;
      local_a8[4].ptr.ptr = *(VineInfo **)&(pRVar6->reader).nestingLimit;
      local_a8[2].ptr.disposer = (Disposer *)contact.builder.pointer;
      local_a8[1].ptr.disposer = (Disposer *)contact.builder.segment;
      local_a8[1].ptr.ptr = (VineInfo *)contact.builder.capTable;
      (*pCVar2->_vptr_Connection[10])(pCVar2,local_28);
      pRVar7 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>::
               operator->((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>
                           *)((long)local_a8[5].ptr.ptr + 0x10));
      (*(pRVar7->super_ClientHook)._vptr_ClientHook[4])(local_c8 + 0x10);
      hook._3_1_ = 1;
      pRVar6 = kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>::operator*
                         ((Own<capnp::AnyPointer::Reader,_std::nullptr_t> *)local_a8[5].ptr.ptr);
      clone<capnp::AnyPointer::Reader&,capnp::AnyPointer>((capnp *)&local_f0,pRVar6);
      kj::
      OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>>
      ::OneOf<kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>,int>
                ((OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>>
                  *)&local_e0,&local_f0);
      kj::heap<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo>((kj *)local_c8,&local_e0);
      kj::Maybe<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t>_>::
      Maybe(local_a8,(Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t> *)
                     local_c8);
      hook._3_1_ = 0;
      kj::
      OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,kj::Own<capnp::ClientHook,decltype(nullptr)>>
      ::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,int>
                ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                  *)__return_storage_ptr__,(VineToExport *)(local_c8 + 0x10));
      RpcClient::VineToExport::~VineToExport((VineToExport *)(local_c8 + 0x10));
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t>::~Own
                ((Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t> *)
                 local_c8);
      VineInfo::~VineInfo(&local_e0);
      kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>::~Own(&local_f0);
      return __return_storage_ptr__;
    }
  }
  _rpcHook1584 = (RpcClient *)ensureAccepted(this);
  pRVar8 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                     (&(this->super_RpcClient).connectionState);
  unwrapIfSameNetwork((RpcConnectionState *)&rpcHook,(ClientHook *)pRVar8);
  _kj_switch_subject =
       (OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception> *)
       kj::_::readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient>
                 ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_&> *)&rpcHook);
  local_110._vptr_Disposer = (_func_int **)_kj_switch_subject;
  if (_kj_switch_subject !=
      (OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception> *)0x0) {
    pRVar8 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                       ((Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t> *)
                        ((long)&_kj_switch_subject->field_1 + 0x18));
    connected = (Connected *)
                kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
                _switchSubject(&pRVar8->connection);
    TVar5 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::which
                      ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>
                        *)connected);
    if (TVar5 == _variant0) {
      local_138 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
                  get<capnp::_::RpcSystemBase::RpcConnectionState::Connected>
                            ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>
                              *)connected);
      pOVar1 = _kj_switch_subject;
      if (local_138 != (Connected *)0x0) {
        _kj_switch_done = local_138;
        pCVar9 = kj::Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t>::operator*
                           (&local_138->connection);
        error = (Exception *)contact.builder.segment;
        local_148 = contact.builder.capTable;
        local_140 = contact.builder.pointer;
        (**(code **)(*(long *)pOVar1 + 0x60))(__return_storage_ptr__,pOVar1,pCVar9,local_28);
        return __return_storage_ptr__;
      }
      local_138 = (Connected *)0x0;
      _kj_switch_done = (Connected *)0x0;
    }
    else if (TVar5 == _variant1) {
      local_160 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
                  get<kj::Exception>((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>
                                      *)connected);
      if (local_160 != (Exception *)0x0) {
        _kj_switch_done_1 = local_160;
        kj::cp<kj::Exception>(&local_300,local_160);
        newBrokenCap((capnp *)&local_170,&local_300);
        kj::
        OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,kj::Own<capnp::ClientHook,decltype(nullptr)>>
        ::OneOf<kj::Own<capnp::ClientHook,decltype(nullptr)>,int>
                  ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                    *)__return_storage_ptr__,&local_170);
        kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_170);
        kj::Exception::~Exception(&local_300);
        return __return_storage_ptr__;
      }
      local_160 = (Exception *)0x0;
      _kj_switch_done_1 = (Exception *)0x0;
    }
    kj::_::unreachable();
  }
  (*(_rpcHook1584->super_ClientHook)._vptr_ClientHook[4])();
  kj::
  OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,kj::Own<capnp::ClientHook,decltype(nullptr)>>
  ::OneOf<kj::Own<capnp::ClientHook,decltype(nullptr)>,int>
            ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::VineToExport,kj::Own<capnp::ClientHook,decltype(nullptr)>>
              *)__return_storage_ptr__,&local_310);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&local_310);
  return __return_storage_ptr__;
}

Assistant:

WriteThirdPartyDescriptorResult writeThirdPartyDescriptor(
          VatNetworkBase::Connection& provider,
          VatNetworkBase::Connection& recipient,
          AnyPointer::Builder contact) override {
      if (state.is<Deferred>() &&
          provider.canForwardThirdPartyToContact(*state.get<Deferred>().contact, recipient)) {
        // We have not accepted this capability yet, and the VatNetwork supports forwarding it!
        // We can get away without accepting the capability.
        auto& deferred = state.get<Deferred>();
        provider.forwardThirdPartyToContact(*deferred.contact, recipient, contact);

        return VineToExport {
          .vine = deferred.vine->addRef(),
          .vineInfo = kj::heap(VineInfo {.info = capnp::clone(*deferred.contact)}),
        };
      } else {
        // Either:
        // a. We already accepted this cap, so we should treat this as a normal three-party handoff
        //    and hand off the cap we accepted. (Actually, this doesn't happen in practice because
        //    the caller would already have resolved to the inner capability in this case.)
        // b. The VatNetwork won't allow forwarding, so we must accept the cap first, and then,
        //    again, hand off the accepted cap.
        auto& hook = ensureAccepted();
        KJ_IF_SOME(rpcHook, connectionState->unwrapIfSameNetwork(hook)) {
          KJ_SWITCH_ONEOF(rpcHook.connectionState->connection) {
            KJ_CASE_ONEOF(connected, Connected) {
              // Common case: the accepted capability is on its own connection, which we're still
              // connected to.
              return rpcHook.writeThirdPartyDescriptor(*connected.connection, recipient, contact);
            }
            KJ_CASE_ONEOF(error, Disconnected) {
              // We accepted the capability but the connection we accepted it on is now dead.
              // Don't fill in `contact` and just return a broken cap.
              return newBrokenCap(kj::cp(error));
            }
          }
          KJ_UNREACHABLE;
        } else {
          // Apparently, when we accepted the capability, it turned out to be a self-introduction
          // and now we're left with a capability pointing into our own vat. We need to return
          // that instead.
          return hook.addRef();
        }
      }